

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ElfParser.cpp
# Opt level: O0

int __thiscall axl::sys::lnx::ElfParser::open(ElfParser *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  long lVar2;
  ElfParser *extraout_RAX;
  Elf64_Shdr *pEVar3;
  ElfParser *extraout_RAX_00;
  Elf64_Shdr *shdrEnd;
  Elf64_Shdr *shdr;
  Elf64_Shdr *stringShdr;
  Elf64_Shdr *shdrTable;
  Elf64_Phdr *phdrTable;
  Elf64_Ehdr *elfHdr;
  char *p;
  char *in_stack_ffffffffffffff68;
  ErrorRef *in_stack_ffffffffffffff70;
  Elf64_Shdr *local_78;
  bool local_1;
  
  close(this,(int)__file);
  if ((((((((___oflag < 0x40) || (*__file != '\x7f')) || (__file[1] != 'E')) ||
         ((__file[2] != 'L' || (__file[3] != 'F')))) ||
        ((*(ushort *)(__file + 0x34) < 0x40 ||
         ((___oflag < *(ushort *)(__file + 0x34) || (*(short *)(__file + 0x36) != 0x38)))))) ||
       (*(short *)(__file + 0x3a) != 0x40)) ||
      (((___oflag < *(ulong *)(__file + 0x20) ||
        (___oflag <
         (ulong)(*(long *)(__file + 0x20) +
                (long)(int)((uint)*(ushort *)(__file + 0x38) * (uint)*(ushort *)(__file + 0x36)))))
       || (___oflag < *(ulong *)(__file + 0x28))))) ||
     (((___oflag <
        (ulong)(*(long *)(__file + 0x28) +
               (long)(int)((uint)*(ushort *)(__file + 0x3c) * (uint)*(ushort *)(__file + 0x3a))) ||
       (*(short *)(__file + 0x3e) == 0)) ||
      (*(ushort *)(__file + 0x3c) <= *(ushort *)(__file + 0x3e))))) {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_1 = err::fail((ErrorRef *)0x14c58d);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x14c5ad);
    this = extraout_RAX;
  }
  else {
    lVar2 = *(long *)(__file + 0x20);
    pEVar3 = (Elf64_Shdr *)(__file + *(long *)(__file + 0x28));
    uVar1 = *(ushort *)(__file + 0x3e);
    for (local_78 = pEVar3; local_78 < pEVar3 + (int)(uint)*(ushort *)(__file + 0x3c);
        local_78 = local_78 + 1) {
      if (((___oflag < local_78->sh_offset) || (___oflag < local_78->sh_offset + local_78->sh_size))
         || (pEVar3[uVar1].sh_size <= (ulong)local_78->sh_name)) {
        err::ErrorRef::ErrorRef(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        local_1 = err::fail((ErrorRef *)0x14c6c2);
        err::ErrorRef::~ErrorRef((ErrorRef *)0x14c6df);
        this = extraout_RAX_00;
        goto LAB_0014c76b;
      }
    }
    this->m_fileSize = ___oflag;
    this->m_elfHdr = (Elf64_Ehdr *)__file;
    this->m_shdrTable = pEVar3;
    this->m_phdrTable = (Elf64_Phdr *)(__file + lVar2);
    this->m_stringTable = __file + pEVar3[uVar1].sh_offset;
    this->m_stringTableSize = pEVar3[uVar1].sh_size;
    local_1 = true;
  }
LAB_0014c76b:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool
ElfParser::open(
	const void* p0,
	size_t size
) {
	close();

	char* p = (char*)p0;
	ElfW(Ehdr)* elfHdr = (ElfW(Ehdr)*)p;

	if (size < sizeof(ElfW(Ehdr)) ||
		elfHdr->e_ident[EI_MAG0] != ELFMAG0 ||
		elfHdr->e_ident[EI_MAG1] != ELFMAG1 ||
		elfHdr->e_ident[EI_MAG2] != ELFMAG2 ||
		elfHdr->e_ident[EI_MAG3] != ELFMAG3 ||
		elfHdr->e_ehsize < sizeof(ElfW(Ehdr)) ||
		elfHdr->e_ehsize > size ||
		elfHdr->e_phentsize != sizeof(ElfW(Phdr)) ||
		elfHdr->e_shentsize != sizeof(ElfW(Shdr)) ||
		elfHdr->e_phoff > size ||
		elfHdr->e_phoff + elfHdr->e_phnum * elfHdr->e_phentsize > size ||
		elfHdr->e_shoff > size ||
		elfHdr->e_shoff + elfHdr->e_shnum * elfHdr->e_shentsize > size ||
		elfHdr->e_shstrndx == SHN_UNDEF ||
		elfHdr->e_shstrndx >= elfHdr->e_shnum
	)
		return err::fail("invalid ELF-file");

	ElfW(Phdr)* phdrTable = (ElfW(Phdr)*)(p + elfHdr->e_phoff);
	ElfW(Shdr)* shdrTable = (ElfW(Shdr)*)(p + elfHdr->e_shoff);
	ElfW(Shdr)* stringShdr = &shdrTable[elfHdr->e_shstrndx];

	ElfW(Shdr)* shdr = shdrTable;
	ElfW(Shdr)* shdrEnd = shdr + elfHdr->e_shnum;
	for (; shdr < shdrEnd; shdr++)
		if (size < shdr->sh_offset ||
			size < shdr->sh_offset + shdr->sh_size ||
			stringShdr->sh_size <= shdr->sh_name)
			return err::fail("invalid section in ELF-file");

	m_fileSize = size;
	m_elfHdr = elfHdr;
	m_shdrTable = shdrTable;
	m_phdrTable = phdrTable;
	m_stringTable = p + stringShdr->sh_offset;
	m_stringTableSize = stringShdr->sh_size;
	return true;
}